

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,int *key,int *value)

{
  BaseDictionary<int,int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *pBVar1;
  hash_t hashCode;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint depth;
  int iVar9;
  long lVar10;
  
  lVar10 = *(long *)this;
  if (lVar10 == 0) {
    BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar10 = *(long *)this;
  }
  hashCode = *key * 2 + 1;
  uVar5 = BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar8 = *(uint *)(lVar10 + (ulong)uVar5 * 4);
  if ((int)uVar8 < 0) {
    depth = 0;
  }
  else {
    depth = 0;
    do {
      if (*(int *)(*(long *)(this + 8) + (ulong)uVar8 * 8) == *key) {
        if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
          return -1;
        }
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
        return -1;
      }
      depth = depth + 1;
      uVar8 = *(uint *)(*(long *)(this + 8) + 4 + (ulong)uVar8 * 8);
    } while (-1 < (int)uVar8);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar6 = *(int *)(this + 0x18);
    iVar9 = *(int *)(this + 0x20);
    if (iVar9 == iVar6) {
      BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)this);
      uVar5 = BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar6 = *(int *)(this + 0x18);
      iVar9 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar9 + 1;
    if (iVar6 < iVar9 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar4) goto LAB_007a41f7;
      *puVar7 = 0;
      iVar6 = *(int *)(this + 0x18);
    }
    if (iVar6 <= iVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar4) goto LAB_007a41f7;
      *puVar7 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar4) goto LAB_007a41f7;
      *puVar7 = 0;
    }
    iVar9 = *(int *)(this + 0x24);
    if (iVar9 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar4) goto LAB_007a41f7;
      *puVar7 = 0;
      iVar9 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar4) {
LAB_007a41f7:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      iVar9 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar6 = BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar9 * 8 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar6;
    }
  }
  lVar10 = *(long *)(this + 8);
  *(int *)(lVar10 + (long)iVar9 * 8) = *value;
  lVar2 = *(long *)this;
  *(undefined4 *)(lVar10 + 4 + (long)iVar9 * 8) = *(undefined4 *)(lVar2 + (ulong)uVar5 * 4);
  *(int *)(lVar2 + (ulong)uVar5 * 4) = iVar9;
  uVar5 = 0;
  iVar6 = iVar9;
  do {
    iVar6 = *(int *)(lVar10 + 4 + (long)iVar6 * 8);
    uVar5 = uVar5 + 1;
  } while (iVar6 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar5);
  }
  return iVar9;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }